

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iStack.h
# Opt level: O2

void __thiscall
Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>::iStack
          (iStack<Imaginer::Utils::iRpn::RPNnode> *this,int *size)

{
  int iVar1;
  RPNnode *pRVar2;
  ulong uVar3;
  long lVar4;
  
  iVar1 = *size;
  lVar4 = (long)iVar1;
  this->_top = -1;
  this->_size = iVar1;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar3 = lVar4 << 4;
  }
  pRVar2 = (RPNnode *)operator_new__(uVar3);
  if (lVar4 != 0) {
    uVar3 = 0;
    do {
      (&pRVar2->_is)[uVar3] = false;
      *(undefined8 *)((long)&pRVar2->_node + uVar3) = 0;
      uVar3 = uVar3 + 0x10;
    } while (lVar4 << 4 != uVar3);
  }
  this->_data = pRVar2;
  return;
}

Assistant:

iStack(const int& size = 1024):_size(size),_top(-1)
    {
        _data = new Type[_size];
    }